

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Serializer::AggregateCollectiveMetadataIndices
          (BP4Serializer *this,Comm *comm,BufferSTL *outBufferSTL)

{
  uint uVar1;
  reference pvVar2;
  vector<char,_std::allocator<char>_> *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  undefined8 in_RDX;
  size_type in_RDI;
  size_t totalExtraSize;
  size_t perStepExtraSize;
  size_t totalStep;
  vector<char,_std::allocator<char>_> *serialized_1;
  vector<char,_std::allocator<char>_> *buffer;
  int i;
  int rankSource;
  size_t localPosition;
  bool isLittleEndian;
  vector<unsigned_long,_std::allocator<unsigned_long>_> headerInfo;
  size_t serializedPosition;
  vector<char,_std::allocator<char>_> *serialized;
  size_t serializedSize;
  anon_class_24_3_d06853d2 lf_SortMergeIndices;
  anon_class_32_4_692c61de lf_LocateAllIndices;
  anon_class_16_2_157d91f4 lf_LocateAttrIndices;
  anon_class_16_2_157d91f4 lf_LocateVarIndices;
  anon_class_8_1_8991fb9c lf_GetCharacteristics;
  anon_class_8_1_8991fb9c lf_LocatePGIndices;
  anon_class_24_3_edd922ae lf_SerializeAllIndices;
  anon_class_8_1_8991fb9c lf_SerializeIndices;
  anon_class_1_0_00000001 lf_IndicesSize;
  BufferSTL inBufferSTL;
  int rank;
  vector<char,_std::allocator<char>_> *in_stack_00000300;
  unordered_map<unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
  *in_stack_00000308;
  unordered_map<unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
  *in_stack_00000310;
  unordered_map<unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>_>_>
  *in_stack_00000318;
  anon_class_24_3_d06853d2 *in_stack_00000320;
  size_t *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  size_t *in_stack_fffffffffffffe48;
  allocator_type *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe60;
  BufferSTL *in_stack_fffffffffffffe80;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  int iVar3;
  int in_stack_fffffffffffffea4;
  uint uVar4;
  Comm *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  allocator_type in_stack_fffffffffffffeb7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  size_t *local_130;
  undefined1 *local_128;
  size_t *local_120;
  undefined8 local_108;
  int *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 local_d0 [8];
  undefined1 *local_c8;
  undefined1 local_c0 [8];
  undefined1 *local_b8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 local_88 [15];
  undefined1 local_79 [45];
  int in_stack_ffffffffffffffb4;
  size_t *in_stack_ffffffffffffffb8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  Comm *in_stack_ffffffffffffffd0;
  int local_1c;
  undefined8 local_18;
  
  local_18 = in_RDX;
  local_1c = helper::Comm::Rank((Comm *)0xc26f79);
  BufferSTL::BufferSTL(in_stack_fffffffffffffe80);
  if (local_1c == 0) {
    std::
    unordered_map<unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>_>_>
    ::clear((unordered_map<unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>_>_>
             *)0xc26fa8);
    std::
    unordered_map<unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
    ::clear((unordered_map<unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
             *)0xc26fb9);
    std::
    unordered_map<unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
    ::clear((unordered_map<unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>_>_>_>_>
             *)0xc26fca);
  }
  local_98 = local_79;
  local_90 = local_88;
  local_c8 = local_b0;
  local_f0 = local_a8;
  local_e0 = local_c0;
  local_d8 = local_d0;
  local_108 = local_18;
  local_f8 = &local_1c;
  local_b8 = local_c8;
  AggregateCollectiveMetadataIndices::anon_class_24_3_edd922ae::operator()
            ((anon_class_24_3_edd922ae *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),
             in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
  local_120 = in_stack_ffffffffffffffb8;
  helper::Comm::GathervVectors<char>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  if (local_1c == 0) {
    local_128 = &stack0xffffffffffffffc8;
    local_130 = (size_t *)0x0;
    __a = (allocator_type *)&stack0xfffffffffffffeb7;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xc2712c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffe60,in_RDI,__a);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xc2714f);
    helper::IsLittleEndian();
    for (; local_130 < local_120; local_130 = (size_t *)(*pvVar2 + 4 + (long)local_130)) {
      uVar1 = helper::ReadValue<unsigned_int>
                        ((vector<char,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         in_stack_fffffffffffffe38,false);
      for (iVar3 = 0; iVar3 < 4; iVar3 = iVar3 + 1) {
        in_stack_fffffffffffffe48 =
             (size_t *)
             helper::ReadValue<unsigned_long>
                       ((vector<char,_std::allocator<char>_> *)__a,in_stack_fffffffffffffe48,
                        SUB41(in_stack_fffffffffffffe44 >> 0x18,0));
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_148,(long)iVar3);
        *pvVar2 = (value_type)in_stack_fffffffffffffe48;
      }
      uVar4 = uVar1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffe90,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88)
      ;
      AggregateCollectiveMetadataIndices::anon_class_32_4_692c61de::operator()
                ((anon_class_32_4_692c61de *)CONCAT44(uVar4,iVar3),in_stack_fffffffffffffe9c,
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_148,0);
      in_stack_fffffffffffffe44 = uVar1;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  }
  if (local_1c == 0) {
    this_00 = (vector<char,_std::allocator<char>_> *)
              std::
              unordered_map<unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>_>_>
              ::size((unordered_map<unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>_>_>_>
                      *)0xc27341);
    this_01 = (vector<char,_std::allocator<char>_> *)((long)this_00 * 0x28);
    std::vector<char,_std::allocator<char>_>::reserve(this_00,0x28);
    std::vector<char,_std::allocator<char>_>::resize(this_01,in_RDI);
    AggregateCollectiveMetadataIndices::anon_class_24_3_d06853d2::operator()
              (in_stack_00000320,in_stack_00000318,in_stack_00000310,in_stack_00000308,
               in_stack_00000300);
  }
  BufferSTL::~BufferSTL((BufferSTL *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  return;
}

Assistant:

void BP4Serializer::AggregateCollectiveMetadataIndices(helper::Comm const &comm,
                                                       BufferSTL &outBufferSTL)
{
    int rank = comm.Rank();

    BufferSTL inBufferSTL;

    // pre-allocate with rank 0 data
    // size_t pgCount = 0; //< tracks global PG count
    if (rank == 0)
    {
        // assumes that things are more or less balanced
        m_PGIndicesInfo.clear();
        // m_PGRankIndices.reserve(m_MetadataSet.PGIndex.Buffer.size());

        m_VariableIndicesInfo.clear();
        // m_VariableRankIndices.reserve(m_MetadataSet.VarsIndices.size());

        m_AttributesIndicesInfo.clear();
        // m_AttributesRankIndices.reserve(m_MetadataSet.AttributesIndices.size());
    }

    auto lf_IndicesSize =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices) -> size_t

    {
        size_t indicesSize = 0;
        for (const auto &indexPair : indices)
        {
            indicesSize += indexPair.second.Buffer.size();
        }
        return indicesSize;
    };

    auto lf_SerializeIndices =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices, size_t &position)

    {
        for (const auto &indexPair : indices)
        {
            const auto &buffer = indexPair.second.Buffer;
            helper::CopyToBuffer(m_SerializedIndices, position, buffer.data(), buffer.size());
        }
    };

    auto lf_SerializeAllIndices = [&](helper::Comm const &comm, const int rank) {
        const size_t pgIndicesSize = m_MetadataSet.PGIndex.Buffer.size();
        const size_t variablesIndicesSize = lf_IndicesSize(m_MetadataSet.VarsIndices);
        const size_t attributesIndicesSize = lf_IndicesSize(m_MetadataSet.AttributesIndices);

        // first pre-allocate
        const size_t serializedIndicesSize =
            8 * 4 + pgIndicesSize + variablesIndicesSize + attributesIndicesSize;

        m_SerializedIndices.reserve(serializedIndicesSize + 4);
        m_SerializedIndices.resize(serializedIndicesSize + 4);

        const uint32_t rank32 = static_cast<uint32_t>(rank);
        const uint64_t size64 = static_cast<uint64_t>(serializedIndicesSize);
        const uint64_t variablesIndexOffset = static_cast<uint64_t>(pgIndicesSize + 36);
        const uint64_t attributesIndexOffset =
            static_cast<uint64_t>(pgIndicesSize + 36 + variablesIndicesSize);

        size_t position = 0;
        helper::CopyToBuffer(m_SerializedIndices, position, &rank32);
        helper::CopyToBuffer(m_SerializedIndices, position, &size64);
        helper::CopyToBuffer(m_SerializedIndices, position, &variablesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &attributesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &m_MetadataSet.DataPGCount);

        helper::CopyToBuffer(m_SerializedIndices, position, m_MetadataSet.PGIndex.Buffer.data(),
                             m_MetadataSet.PGIndex.Buffer.size());
        lf_SerializeIndices(m_MetadataSet.VarsIndices, position);
        lf_SerializeIndices(m_MetadataSet.AttributesIndices, position);
    };

    auto lf_LocatePGIndices =
        [&](std::unordered_map<size_t, std::vector<std::tuple<size_t, size_t, size_t>>>
                &pgIndicesInfo,
            const int rankSource, const std::vector<char> &serialized, const size_t position,
            const size_t endPosition) {
            size_t stepStartPosition = position;
            size_t stepBuffersize = 0;
            size_t pgCountPerStep = 0;
            size_t localPosition = position;
            uint32_t currentStep = 0;

            while (localPosition < endPosition)
            {
                size_t indexPosition = localPosition;
                const ProcessGroupIndex header = ReadProcessGroupIndexHeader(
                    serialized, indexPosition, helper::IsLittleEndian());
                if (header.Step == currentStep)
                {
                    stepBuffersize += header.Length + 2;
                    pgCountPerStep++;
                }
                else
                {
                    // found a new step
                    if (currentStep == 0)
                    {
                        // start of going through a new pg buffer
                        stepStartPosition = localPosition;
                        stepBuffersize = header.Length + 2;
                        pgCountPerStep = 1;
                        currentStep = header.Step;
                    }
                    else
                    {
                        // record the pg info of previous step
                        std::tuple<size_t, size_t, size_t> stepPGIndexTuple =
                            std::make_tuple(pgCountPerStep, stepStartPosition, stepBuffersize);
                        auto search = pgIndicesInfo.find(currentStep);
                        if (search == pgIndicesInfo.end())
                        {
                            // the time step hasn't been added to the
                            // unordered_map, add it
                            pgIndicesInfo.emplace(
                                currentStep, std::vector<std::tuple<size_t, size_t, size_t>>());
                            pgIndicesInfo[currentStep].push_back(stepPGIndexTuple);
                        }
                        else
                        {
                            pgIndicesInfo[currentStep].push_back(stepPGIndexTuple);
                        }
                        stepStartPosition = localPosition;
                        stepBuffersize = header.Length + 2;
                        pgCountPerStep = 1;
                        currentStep = header.Step;
                    }
                }
                localPosition += header.Length + 2;
                if (localPosition >= endPosition)
                {
                    // record the pg info of the last step
                    std::tuple<size_t, size_t, size_t> stepPGIndexTuple =
                        std::make_tuple(pgCountPerStep, stepStartPosition, stepBuffersize);
                    auto search = pgIndicesInfo.find(currentStep);
                    if (search == pgIndicesInfo.end())
                    {
                        // the time step hasn't been added to the unordered_map,
                        // add it
                        pgIndicesInfo.emplace(currentStep,
                                              std::vector<std::tuple<size_t, size_t, size_t>>());
                        pgIndicesInfo[currentStep].push_back(stepPGIndexTuple);
                    }
                    else
                    {
                        pgIndicesInfo[currentStep].push_back(stepPGIndexTuple);
                    }
                }
            }
        };

    auto lf_GetCharacteristics = [&](const std::vector<char> &buffer, size_t &position,
                                     const uint8_t dataType, uint8_t &count, uint32_t &length,
                                     uint32_t &timeStep)

    {
        const DataTypes dataTypeEnum = static_cast<DataTypes>(dataType);
        const bool isLittleEndian = helper::IsLittleEndian();

        switch (dataTypeEnum)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        size_t irrelevant;                                                                         \
        const auto characteristics = ReadElementIndexCharacteristics<T>(                           \
            buffer, position, TypeTraits<T>::type_enum, irrelevant, true, isLittleEndian);         \
        count = characteristics.EntryCount;                                                        \
        length = characteristics.EntryLength;                                                      \
        timeStep = characteristics.Statistics.Step;                                                \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        case (type_string_array): {
            size_t irrelevant;
            const auto characteristics = ReadElementIndexCharacteristics<std::string>(
                buffer, position, type_string_array, irrelevant, true, isLittleEndian);
            count = characteristics.EntryCount;
            length = characteristics.EntryLength;
            timeStep = characteristics.Statistics.Step;
            break;
        }

        default:
            helper::Throw<std::invalid_argument>(
                "Toolkit", "format::bp::BP4Serializer", "AggregateCollectiveMetadataIndices",
                "type " + std::to_string(dataType) + " not supported in BP4 Metadata Merge");

        } // end switch
    };

    auto lf_LocateVarIndices =
        [&](std::unordered_map<
                size_t, std::unordered_map<std::string, std::vector<std::tuple<size_t, size_t>>>>
                &indicesInfo,
            const int rankSource, const std::vector<char> &serialized, const size_t position,
            const size_t endPosition)

    {
        // uint32_t currentStep = 0;

        size_t localPosition = position;
        while (localPosition < endPosition)
        {
            // std::cout << "var localPosition: " << localPosition << std::endl;
            size_t indexPosition = localPosition;
            const ElementIndexHeader header =
                ReadElementIndexHeader(serialized, indexPosition, helper::IsLittleEndian());

            // std::cout << "var indexPosition after ReadElementIndexHeader: "
            // << indexPosition << std::endl;

            uint8_t count = 0;
            uint32_t length = 0;
            uint32_t timeStep = 0;

            lf_GetCharacteristics(serialized, indexPosition, header.DataType, count, length,
                                  timeStep);

            size_t varIndexBufferSize = static_cast<size_t>(header.Length) + 4;

            auto stepSearch = indicesInfo.find(timeStep);
            if (stepSearch == indicesInfo.end())
            {

                // the time step hasn't been added to the unordered_map, add it
                std::unordered_map<std::string, std::vector<std::tuple<size_t, size_t>>>
                    varIndexInfo;
                varIndexInfo.emplace(header.Name, std::vector<std::tuple<size_t, size_t>>());
                std::tuple<size_t, size_t> varIndexTuple =
                    std::make_tuple(localPosition, varIndexBufferSize);
                varIndexInfo[header.Name].push_back(varIndexTuple);
                indicesInfo.emplace(timeStep, varIndexInfo);
            }
            else
            {

                auto varSearch = indicesInfo[timeStep].find(header.Name);
                if (varSearch == indicesInfo[timeStep].end())
                {
                    // found a new variable at this step
                    indicesInfo[timeStep].emplace(header.Name,
                                                  std::vector<std::tuple<size_t, size_t>>());
                    std::tuple<size_t, size_t> varIndexTuple =
                        std::make_tuple(localPosition, varIndexBufferSize);
                    indicesInfo[timeStep][header.Name].push_back(varIndexTuple);
                }
                else
                {
                    // variable already exists, insert the location info of this
                    // variable for this rank
                    std::tuple<size_t, size_t> varIndexTuple =
                        std::make_tuple(localPosition, varIndexBufferSize);
                    indicesInfo[timeStep][header.Name].push_back(varIndexTuple);
                }
            }

            localPosition += varIndexBufferSize;
        }
    };

    auto lf_LocateAttrIndices =
        [&](std::unordered_map<
                size_t, std::unordered_map<std::string, std::vector<std::tuple<size_t, size_t>>>>
                &indicesInfo,
            const int rankSource, const std::vector<char> &serialized, const size_t position,
            const size_t endPosition)

    {
        size_t localPosition = position;
        while (localPosition < endPosition)
        {
            size_t indexPosition = localPosition;
            const ElementIndexHeader header =
                ReadElementIndexHeader(serialized, indexPosition, helper::IsLittleEndian());

            uint8_t count = 0;
            uint32_t length = 0;
            uint32_t timeStep = 0;

            lf_GetCharacteristics(serialized, indexPosition, header.DataType, count, length,
                                  timeStep);

            size_t attrIndexBufferSize = static_cast<size_t>(header.Length) + 4;

            if (indicesInfo[timeStep][header.Name].size() == 1)
            {
                localPosition += attrIndexBufferSize;
                continue;
            }

            auto stepSearch = indicesInfo.find(timeStep);
            if (stepSearch == indicesInfo.end())
            {
                // the time step hasn't been added to the unordered_map, add it
                std::unordered_map<std::string, std::vector<std::tuple<size_t, size_t>>>
                    attrIndexInfo;
                attrIndexInfo.emplace(header.Name, std::vector<std::tuple<size_t, size_t>>());
                std::tuple<size_t, size_t> attrIndexTuple =
                    std::make_tuple(localPosition, attrIndexBufferSize);
                attrIndexInfo[header.Name].push_back(attrIndexTuple);
                indicesInfo.emplace(timeStep, attrIndexInfo);
            }
            else
            {
                // found a new step of a new rank
                auto attrSearch = indicesInfo[timeStep].find(header.Name);
                if (attrSearch == indicesInfo[timeStep].end())
                {
                    // found a new attribute at this step
                    indicesInfo[timeStep].emplace(header.Name,
                                                  std::vector<std::tuple<size_t, size_t>>());
                    std::tuple<size_t, size_t> attrIndexTuple =
                        std::make_tuple(localPosition, attrIndexBufferSize);
                    indicesInfo[timeStep][header.Name].push_back(attrIndexTuple);
                }
                else
                {
                    // attribute already exists, insert the location info of
                    // this attribute for this rank
                    std::tuple<size_t, size_t> attrIndexTuple =
                        std::make_tuple(localPosition, attrIndexBufferSize);
                    indicesInfo[timeStep][header.Name].push_back(attrIndexTuple);
                }
            }

            localPosition += attrIndexBufferSize;
        }
    };

    auto lf_LocateAllIndices = [&](const int rankSource, const std::vector<size_t> headerInfo,
                                   const std::vector<char> &serialized, const size_t position)

    {
        const size_t rankIndicesSize = headerInfo[0];
        const size_t variablesIndexOffset = headerInfo[1] + position;
        const size_t attributesIndexOffset = headerInfo[2] + position;
        size_t localPosition = position + 36;

        size_t endPosition = variablesIndexOffset;
        // first deserialize pg indices
        lf_LocatePGIndices(m_PGIndicesInfo, rankSource, serialized, localPosition, endPosition);

        // deserialize variable indices
        localPosition = variablesIndexOffset;
        endPosition = attributesIndexOffset;

        lf_LocateVarIndices(m_VariableIndicesInfo, rankSource, serialized, localPosition,
                            endPosition);

        // deserialize attributes indices
        localPosition = attributesIndexOffset;
        endPosition = rankIndicesSize + 4 + position;
        // attributes are constant and unique across ranks
        lf_LocateAttrIndices(m_AttributesIndicesInfo, rankSource, serialized, localPosition,
                             endPosition);
    };

    auto lf_SortMergeIndices =
        [&](const std::unordered_map<size_t, std::vector<std::tuple<size_t, size_t, size_t>>>
                &pgIndicesInfo,
            const std::unordered_map<
                size_t, std::unordered_map<std::string, std::vector<std::tuple<size_t, size_t>>>>
                &varIndicesInfo,
            const std::unordered_map<
                size_t, std::unordered_map<std::string, std::vector<std::tuple<size_t, size_t>>>>
                &attrIndicesInfo,
            const std::vector<char> &serialized) {
            auto &position = outBufferSTL.m_Position;
            auto &buffer = outBufferSTL.m_Buffer;

            std::vector<size_t> timeSteps;
            timeSteps.reserve(pgIndicesInfo.size());
            for (auto const &pair : pgIndicesInfo)
            {
                timeSteps.push_back(pair.first);
            }
            std::sort(timeSteps.begin(), timeSteps.end());
            m_MetadataIndexTable[rank] = {};
            for (auto t : timeSteps)
            {
                std::vector<uint64_t> ptrs;

                const uint64_t pgIndexStart = position;
                ptrs.push_back(pgIndexStart);
                std::vector<std::tuple<size_t, size_t, size_t>> perStepPGIndicesInfo =
                    pgIndicesInfo.at(t);
                size_t perStepPGCountPosition = position;
                position += 16; // skip the pgcount and pglength
                uint64_t perStepPGCountU64 = 0;

                for (auto &item : perStepPGIndicesInfo)
                {
                    size_t start = std::get<1>(item);
                    size_t length = std::get<2>(item);
                    std::copy(serialized.begin() + start, serialized.begin() + start + length,
                              buffer.begin() + position);
                    position += length;
                    perStepPGCountU64 += std::get<0>(item);
                }
                uint64_t perStepPGLengthU64 = position - perStepPGCountPosition - 16;
                helper::CopyToBuffer(buffer, perStepPGCountPosition, &perStepPGCountU64);
                helper::CopyToBuffer(buffer, perStepPGCountPosition, &perStepPGLengthU64);

                const uint64_t variablesIndexStart = position;
                ptrs.push_back(variablesIndexStart);
                const auto itvars = varIndicesInfo.find(t);
                if (itvars != varIndicesInfo.end())
                {
                    const auto perStepVarIndicesInfo = itvars->second;
                    size_t perStepVarCountPosition = position;
                    const uint32_t perStepVarCountU32 =
                        static_cast<uint32_t>(perStepVarIndicesInfo.size());
                    helper::CopyToBuffer(buffer, perStepVarCountPosition, &perStepVarCountU32);
                    position += 12; // skip for count and length

                    for (auto const &pair : perStepVarIndicesInfo)
                    {
                        const size_t entryLengthPosition = position;
                        size_t headerStartPosition = std::get<0>(pair.second[0]);
                        size_t localPosition = headerStartPosition;
                        ElementIndexHeader header =
                            ReadElementIndexHeader(serialized, localPosition);
                        size_t headerSize = localPosition - headerStartPosition;

                        position += headerSize; // skip the header
                        uint64_t setsCount = 0;
                        for (auto &item : pair.second)
                        {
                            size_t start = std::get<0>(item);
                            size_t length = std::get<1>(item);
                            std::copy(serialized.begin() + start + headerSize,
                                      serialized.begin() + start + length,
                                      buffer.begin() + position);
                            position += length - headerSize;
                            setsCount += header.CharacteristicsSetsCount;
                        }
                        const uint32_t entryLength =
                            static_cast<uint32_t>(position - entryLengthPosition - 4);
                        size_t backPosition = entryLengthPosition;
                        helper::CopyToBuffer(buffer, backPosition, &entryLength);
                        helper::CopyToBuffer(buffer, backPosition,
                                             &serialized[headerStartPosition + 4],
                                             headerSize - 8 - 4);
                        helper::CopyToBuffer(buffer, backPosition, &setsCount);
                    }
                    const uint64_t perStepVarLengthU64 =
                        static_cast<uint64_t>(position - perStepVarCountPosition - 8);
                    helper::CopyToBuffer(buffer, perStepVarCountPosition, &perStepVarLengthU64);
                }
                else
                {
                    size_t perStepVarCountPosition = position;
                    const uint32_t perStepVarCountU32 = static_cast<uint32_t>(0);
                    helper::CopyToBuffer(buffer, perStepVarCountPosition, &perStepVarCountU32);
                    const uint64_t perStepVarLengthU64 = static_cast<uint64_t>(0);
                    helper::CopyToBuffer(buffer, perStepVarCountPosition, &perStepVarLengthU64);
                    position += 12; // skip for count and length
                }

                const uint64_t attributesIndexStart = position;
                ptrs.push_back(attributesIndexStart);

                const auto itattrs = attrIndicesInfo.find(t);
                if (itattrs != attrIndicesInfo.end())
                {
                    const auto perStepAttrIndicesInfo = itattrs->second;
                    size_t perStepAttrCountPosition = position;
                    const uint32_t perStepAttrCountU32 =
                        static_cast<uint32_t>(perStepAttrIndicesInfo.size());
                    helper::CopyToBuffer(buffer, perStepAttrCountPosition, &perStepAttrCountU32);
                    position += 12; // skip for length

                    for (auto const &pair : perStepAttrIndicesInfo)
                    {
                        for (auto &item : pair.second)
                        {
                            size_t start = std::get<0>(item);
                            size_t length = std::get<1>(item);
                            std::copy(serialized.begin() + start,
                                      serialized.begin() + start + length,
                                      buffer.begin() + position);
                            position += length;
                        }
                    }
                    const uint64_t perStepAttrLengthU64 =
                        static_cast<uint64_t>(position - perStepAttrCountPosition - 8);
                    helper::CopyToBuffer(buffer, perStepAttrCountPosition, &perStepAttrLengthU64);
                }
                else
                {
                    size_t perStepAttrCountPosition = position;
                    const uint32_t perStepAttrCountU32 = static_cast<uint32_t>(0);
                    helper::CopyToBuffer(buffer, perStepAttrCountPosition, &perStepAttrCountU32);
                    const uint64_t perStepAttrLengthU64 = static_cast<uint64_t>(0);
                    helper::CopyToBuffer(buffer, perStepAttrCountPosition, &perStepAttrLengthU64);
                    position += 12; // skip for count and length
                }

                const uint64_t currentStepEndPos = position;
                ptrs.push_back(currentStepEndPos);
                m_MetadataIndexTable[rank][t] = ptrs;
            }
        };

    // BODY of function starts here
    lf_SerializeAllIndices(comm, rank); // Set m_SerializedIndices

    comm.GathervVectors(m_SerializedIndices, inBufferSTL.m_Buffer, inBufferSTL.m_Position, 0);

    // deserialize, it's all local inside rank 0
    if (rank == 0)
    {
        const size_t serializedSize = inBufferSTL.m_Position;
        const std::vector<char> &serialized = inBufferSTL.m_Buffer;
        size_t serializedPosition = 0;
        std::vector<size_t> headerInfo(4);
        const bool isLittleEndian = helper::IsLittleEndian();

        while (serializedPosition < serializedSize)
        {
            size_t localPosition = serializedPosition;

            const int rankSource = static_cast<int>(
                helper::ReadValue<uint32_t>(serialized, localPosition, isLittleEndian));

            for (auto i = 0; i < 4; ++i)
            {
                headerInfo[i] = static_cast<size_t>(
                    helper::ReadValue<uint64_t>(serialized, localPosition, isLittleEndian));
            }

            lf_LocateAllIndices(rankSource, headerInfo, serialized, serializedPosition);
            serializedPosition += headerInfo[0] + 4;
        }
    }

    // now merge (and sort variables and attributes) indices
    if (rank == 0)
    {
        auto &buffer = outBufferSTL.m_Buffer;
        const std::vector<char> &serialized = inBufferSTL.m_Buffer;

        size_t totalStep = m_PGIndicesInfo.size();
        size_t perStepExtraSize = 16 + 12 + 12;
        const size_t totalExtraSize = totalStep * perStepExtraSize;
        buffer.reserve(outBufferSTL.m_Position + inBufferSTL.m_Position + totalExtraSize);
        buffer.resize(outBufferSTL.m_Position + inBufferSTL.m_Position + totalExtraSize);
        lf_SortMergeIndices(m_PGIndicesInfo, m_VariableIndicesInfo, m_AttributesIndicesInfo,
                            serialized);
    }
}